

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O0

void print<std::__cxx11::list<double,std::allocator<double>>>
               (list<double,_std::allocator<double>_> *t,char *s)

{
  bool bVar1;
  ostream *poVar2;
  reference pdVar3;
  _Self local_38;
  _List_node_base *local_30;
  int local_24;
  _List_const_iterator<double> local_20;
  const_iterator it;
  char *s_local;
  list<double,_std::allocator<double>_> *t_local;
  
  it._M_node = (_List_node_base *)s;
  std::_List_const_iterator<double>::_List_const_iterator(&local_20);
  local_24 = (int)std::setw(3);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)local_24);
  poVar2 = std::operator<<(poVar2,(char *)it._M_node);
  std::operator<<(poVar2," contains:");
  local_30 = (_List_node_base *)std::__cxx11::list<double,_std::allocator<double>_>::begin(t);
  local_20._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)std::__cxx11::list<double,_std::allocator<double>_>::end(t);
    bVar1 = std::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,' ');
    pdVar3 = std::_List_const_iterator<double>::operator*(&local_20);
    std::ostream::operator<<(poVar2,*pdVar3);
    std::_List_const_iterator<double>::operator++(&local_20);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void	print(T const & t, char const * s) {
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}